

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,IStringFromParts *parts)

{
  ValueLength *pVVar1;
  pointer pCVar2;
  ValueLength VVar3;
  ValueLength VVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  undefined1 auVar8 [16];
  
  pCVar2 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_start != pCVar2) &&
     ((this->_start[pCVar2[-1].startPos] == '\x14' || (this->_start[pCVar2[-1].startPos] == '\v'))))
  {
    this->_keyWritten = (bool)(this->_keyWritten ^ 1);
  }
  VVar3 = this->_pos;
  uVar5 = (**(code **)(*(long *)parts + 0x18))(parts);
  if (uVar5 < 0x7f) {
    reserve(this,uVar5 + 1);
    VVar4 = this->_pos;
    this->_pos = VVar4 + 1;
    this->_start[VVar4] = (char)uVar5 + '@';
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
  }
  else {
    reserve(this,uVar5 + 9);
    VVar4 = this->_pos;
    this->_pos = VVar4 + 1;
    this->_start[VVar4] = 0xbf;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    lVar6 = 8;
    do {
      VVar4 = this->_pos;
      this->_pos = VVar4 + 1;
      this->_start[VVar4] = (uint8_t)uVar5;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      uVar5 = uVar5 >> 8;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  lVar6 = (**(code **)(*(long *)parts + 0x10))(parts);
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      auVar8 = (**(code **)(*(long *)parts + 0x20))(parts,lVar7);
      __n = auVar8._0_8_;
      if (__n != 0) {
        memcpy(this->_start + this->_pos,auVar8._8_8_,__n);
        this->_pos = this->_pos + __n;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + __n;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  return this->_start + VVar3;
}

Assistant:

uint8_t* Builder::set(IStringFromParts const& parts) {
  // This method builds a single VPack String item composed of the 2 parts.
  auto const oldPos = _pos;

  checkKeyHasValidType(true);

  uint64_t length = parts.totalLength();
  if (length > 126) {
    // long string
    reserve(1 + 8 + length);
    appendByteUnchecked(0xbf);
    appendLengthUnchecked<8>(length);
  } else {
    // short string
    reserve(1 + length);
    appendByteUnchecked(static_cast<uint8_t>(0x40 + length));
  }
  for (std::size_t idx = 0, size = parts.numberOfParts(); idx != size; ++idx) {
    auto part = parts(idx);
    if (part.size() != 0) {
      std::memcpy(_start + _pos, part.data(), checkOverflow(part.size()));
      advance(part.size());
    }
  }
  return _start + oldPos;
}